

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_c99.c
# Opt level: O3

void test_s64(void)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  uVar2 = 0;
  lVar3 = SUB168((ZEXT816(0x10000000) << 0x40) % ZEXT816(0x3fffff87),0);
  bVar7 = 0x1fffffff < lVar3 - 0x1fffff88U;
  if (bVar7) {
    bVar1 = 0xdd;
    uVar2 = (ulong)(0x3fffff86 < (ulong)(lVar3 * 2));
  }
  else {
    bVar1 = 0x9c;
  }
  printf("Testing int64_t, %ld from %ld to %ld, step %ld\n",0xffffffffc0000079,0xffffffff800000f5,
         0xfffffe1c,0xbffff);
  lVar6 = -0x800bff0a;
  lVar3 = 0x7fffff0b;
  bVar1 = bVar1 & 0x1d;
  do {
    lVar6 = lVar6 + 0xbffff;
    if (uVar2 == 0xffffffffffffffff) {
      lVar5 = -1L << bVar1;
      if (-1 < lVar6) {
        lVar5 = -1;
      }
      lVar5 = (lVar5 + lVar3 >> bVar1) + 1;
    }
    else {
      lVar5 = 0;
      if (bVar7) {
        lVar5 = lVar6;
      }
      lVar5 = SUB168(SEXT816(lVar6) * SEXT816((long)~uVar2),8) - lVar5;
      lVar5 = (lVar5 >> bVar1) - (lVar5 >> 0x3f);
    }
    lVar4 = SUB168(SEXT816(lVar6) * SEXT816(0x7fffff0dfffe3677),8) - lVar6;
    if (lVar5 != (lVar4 >> 0x1d) - (lVar4 >> 0x3f)) {
      fprintf(_stderr,"Division fail: int64_t, %ld/%ld. Native: %ld, Libdivide %ld\n",lVar6,
              0xffffffffc0000079);
    }
    lVar3 = lVar3 + -0xbffff;
  } while (lVar6 < 0xfff3fe1d);
  return;
}

Assistant:

void test_s64(void) {
   int64_t denom =  -(((int64_t)2 << 29) - 121); // Prime - see https://primes.utm.edu/lists/2small/0bit.html
   struct libdivide_s64_t divider = libdivide_s64_gen(denom);
#define OP_S64(numer, divider) libdivide_s64_do(numer, &divider)
   TEST_BODY(int64_t, INT64_MAX, denom, divider, PRId64, OP_S64)
}